

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

double __thiscall HPresolve::getRowDualPost(HPresolve *this,int row,int col)

{
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  double dVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  size_type __n_00;
  double dVar5;
  double local_68;
  
  __n_00 = (size_type)col;
  pvVar3 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Astart,__n_00);
  __n = (size_type)*pvVar3;
  this_00 = &(this->super_HPreData).Aindex;
  local_68 = 0.0;
  while( true ) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Aend,__n_00);
    if ((long)*pvVar3 <= (long)__n) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       (&(this->super_HPreData).flagRow,(long)*pvVar3);
    if (*pvVar3 != 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
      if (*pvVar3 != row) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           (&(this->super_HPreData).Avalue,__n);
        dVar1 = *pvVar4;
        pvVar3 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           (&(this->super_HPreData).valueRowDual,(long)*pvVar3);
        local_68 = local_68 + dVar1 * *pvVar4;
      }
    }
    __n = __n + 1;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).colCostAtEl,__n_00);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).valueColDual,__n_00);
  dVar2 = *pvVar4;
  dVar5 = HPreData::getaij(&this->super_HPreData,row,col);
  return -((local_68 + dVar1) - dVar2) / dVar5;
}

Assistant:

double HPresolve::getRowDualPost(int row, int col) {
	double x = 0;

	for (int kk=Astart.at(col); kk<Aend.at(col);++kk)
		if (flagRow.at(Aindex.at(kk)) && Aindex.at(kk) != row)
			x = x + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));

	x = x + colCostAtEl.at(col) - valueColDual.at(col);

	double y=getaij(row,col);
	return -x/y;
}